

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

EdgeIdx __thiscall Escape::CGraph::getEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  EdgeIdx mid;
  EdgeIdx high;
  EdgeIdx low;
  VertexIdx v2_local;
  VertexIdx v1_local;
  CGraph *this_local;
  
  if (v1 < this->nVertices) {
    high = this->offsets[v1];
    mid = this->offsets[v1 + 1] + -1;
    while (high <= mid) {
      lVar1 = (high + mid) / 2;
      if (this->nbors[lVar1] == v2) {
        return lVar1;
      }
      if (v2 < this->nbors[lVar1]) {
        mid = lVar1 + -1;
      }
      else {
        high = lVar1 + 1;
      }
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdgeBinary(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2)
            return mid;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}